

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXcFramework.cxx
# Opt level: O0

cmXcFrameworkPlistLibrary * __thiscall
cmXcFrameworkPlist::SelectSuitableLibrary
          (cmXcFrameworkPlist *this,cmMakefile *mf,cmListFileBacktrace *bt)

{
  bool bVar1;
  __type _Var2;
  __optional_eq_t<cmXcFrameworkPlistSupportedPlatformVariant,_cmXcFrameworkPlistSupportedPlatformVariant>
  _Var3;
  string *psVar4;
  cmake *this_00;
  char local_f9;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [8];
  string supportedSystemName;
  cmXcFrameworkPlistLibrary *lib;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_> *__range1;
  _Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant> local_84;
  optional<cmXcFrameworkPlistSupportedPlatformVariant> systemVariant;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string systemName;
  cmListFileBacktrace *bt_local;
  cmMakefile *mf_local;
  cmXcFrameworkPlist *this_local;
  
  systemName.field_2._8_8_ = bt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_SYSTEM_NAME",&local_69);
  psVar4 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::__cxx11::string::string((string *)local_48,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::optional<cmXcFrameworkPlistSupportedPlatformVariant>::optional
            ((optional<cmXcFrameworkPlistSupportedPlatformVariant> *)&local_84);
  bVar1 = cmMakefile::PlatformIsAppleSimulator(mf);
  if (bVar1) {
    __range1._0_4_ = 1;
    std::optional<cmXcFrameworkPlistSupportedPlatformVariant>::
    optional<cmXcFrameworkPlistSupportedPlatformVariant,_true>
              ((optional<cmXcFrameworkPlistSupportedPlatformVariant> *)((long)&__range1 + 4),
               (cmXcFrameworkPlistSupportedPlatformVariant *)&__range1);
    local_84 = stack0xffffffffffffff74;
  }
  __end1 = std::vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>::begin
                     (&this->AvailableLibraries);
  lib = (cmXcFrameworkPlistLibrary *)
        std::vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>::end
                  (&this->AvailableLibraries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmXcFrameworkPlistLibrary_*,_std::vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>_>
                                     *)&lib), bVar1) {
    supportedSystemName.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmXcFrameworkPlistLibrary_*,_std::vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_d0);
    switch(*(undefined4 *)(supportedSystemName.field_2._8_8_ + 0x78)) {
    case 0:
      std::__cxx11::string::operator=((string *)local_d0,"Darwin");
      break;
    case 1:
      std::__cxx11::string::operator=((string *)local_d0,"iOS");
      break;
    case 2:
      std::__cxx11::string::operator=((string *)local_d0,"tvOS");
      break;
    case 3:
      std::__cxx11::string::operator=((string *)local_d0,"watchOS");
      break;
    case 4:
      std::__cxx11::string::operator=((string *)local_d0,"visionOS");
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0);
    if ((_Var2) &&
       (_Var3 = std::operator==((optional<cmXcFrameworkPlistSupportedPlatformVariant> *)&local_84,
                                (optional<cmXcFrameworkPlistSupportedPlatformVariant> *)
                                (supportedSystemName.field_2._8_8_ + 0x7c)), _Var3)) {
      this_local = (cmXcFrameworkPlist *)supportedSystemName.field_2._8_8_;
      local_d4 = 1;
    }
    else {
      local_d4 = 0;
    }
    std::__cxx11::string::~string((string *)local_d0);
    if (local_d4 != 0) goto LAB_00384d77;
    __gnu_cxx::
    __normal_iterator<const_cmXcFrameworkPlistLibrary_*,_std::vector<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>_>
    ::operator++(&__end1);
  }
  this_00 = cmMakefile::GetCMakeInstance(mf);
  local_f9 = '\"';
  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&,char>
            (&local_f8,(char (*) [39])"Unable to find suitable library in:\n  ",&this->Path,
             (char (*) [19])"\nfor system name \"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,&local_f9
            );
  cmake::IssueMessage(this_00,FATAL_ERROR,&local_f8,(cmListFileBacktrace *)systemName.field_2._8_8_)
  ;
  std::__cxx11::string::~string((string *)&local_f8);
  this_local = (cmXcFrameworkPlist *)0x0;
  local_d4 = 1;
LAB_00384d77:
  std::__cxx11::string::~string((string *)local_48);
  return (cmXcFrameworkPlistLibrary *)this_local;
}

Assistant:

const cmXcFrameworkPlistLibrary* cmXcFrameworkPlist::SelectSuitableLibrary(
  const cmMakefile& mf, const cmListFileBacktrace& bt) const
{
  auto systemName = mf.GetSafeDefinition("CMAKE_SYSTEM_NAME");
  cm::optional<cmXcFrameworkPlistSupportedPlatformVariant> systemVariant;
  if (mf.PlatformIsAppleSimulator()) {
    systemVariant = cmXcFrameworkPlistSupportedPlatformVariant::simulator;
  }

  for (auto const& lib : this->AvailableLibraries) {
    std::string supportedSystemName;
    switch (lib.SupportedPlatform) {
      case cmXcFrameworkPlistSupportedPlatform::macOS:
        supportedSystemName = "Darwin";
        break;
      case cmXcFrameworkPlistSupportedPlatform::iOS:
        supportedSystemName = "iOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::tvOS:
        supportedSystemName = "tvOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::watchOS:
        supportedSystemName = "watchOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::visionOS:
        supportedSystemName = "visionOS";
        break;
    }

    if (systemName == supportedSystemName &&
        systemVariant == lib.SupportedPlatformVariant) {
      return &lib;
    }
  }

  mf.GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Unable to find suitable library in:\n  ", this->Path,
             "\nfor system name \"", systemName, '"'),
    bt);
  return nullptr;
}